

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_classes.h
# Opt level: O0

t_symbol * object_classname(t_object *x)

{
  t_class *this;
  mapped_type p_Var1;
  mapped_type *pp_Var2;
  allocator<char> local_49;
  key_type local_48;
  t_class *c;
  t_mock_messlist *mock_messlist;
  t_object *o;
  t_object *x_local;
  
  this = (t_class *)x->o_messlist;
  c = this;
  mock_messlist = (t_mock_messlist *)x;
  o = x;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"###CLASS###",&local_49);
  pp_Var2 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*(*)(void_*,_...),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*(*)(void_*,_...)>_>_>
            ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*(*)(void_*,____),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*(*)(void_*,____)>_>_>
                          *)this,&local_48);
  p_Var1 = *pp_Var2;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return *(t_symbol **)p_Var1;
}

Assistant:

MOCK_EXPORT t_symbol *object_classname(t_object *x)
{
    t_object		*o = (t_object*)x;
    t_mock_messlist *mock_messlist = (t_mock_messlist*)o->o_messlist;
    t_class			*c = (t_class *) ((*mock_messlist)["###CLASS###"]);

    return c->c_sym;
}